

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall backend::codegen::Codegen::add_collapsed_var(Codegen *this,VarId *tgt,VarId *item)

{
  VarId *in_RDX;
  VarId *in_RDI;
  VarId item_src;
  VarId tgt_src;
  VarId *in_stack_ffffffffffffffb0;
  key_type *in_stack_ffffffffffffffb8;
  VarId *in_stack_ffffffffffffffc0;
  Codegen *in_stack_ffffffffffffffc8;
  
  mir::inst::VarId::VarId(in_RDI,in_RDX);
  get_collapsed_var(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  mir::inst::VarId::VarId(in_RDI,in_RDX);
  get_collapsed_var(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::
  unordered_map<mir::inst::VarId,mir::inst::VarId,std::hash<mir::inst::VarId>,std::equal_to<mir::inst::VarId>,std::allocator<std::pair<mir::inst::VarId_const,mir::inst::VarId>>>
  ::insert_or_assign<mir::inst::VarId&>
            ((unordered_map<mir::inst::VarId,_mir::inst::VarId,_std::hash<mir::inst::VarId>,_std::equal_to<mir::inst::VarId>,_std::allocator<std::pair<const_mir::inst::VarId,_mir::inst::VarId>_>_>
              *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  return;
}

Assistant:

void Codegen::add_collapsed_var(mir::inst::VarId tgt, mir::inst::VarId item) {
  auto tgt_src = get_collapsed_var(tgt);
  auto item_src = get_collapsed_var(item);

  var_collapse.insert_or_assign(item_src, tgt_src);
}